

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
 __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::parser::parse_internal(parser *this,bool keep)

{
  lexer *this_00;
  parser *this_01;
  value_t vVar1;
  bool bVar2;
  token_type tVar3;
  undefined8 *puVar4;
  reference this_02;
  undefined8 uVar5;
  byte in_DL;
  json_value extraout_RDX;
  json_value extraout_RDX_00;
  json_value extraout_RDX_01;
  json_value extraout_RDX_02;
  json_value extraout_RDX_03;
  json_value extraout_RDX_04;
  json_value extraout_RDX_05;
  json_value extraout_RDX_06;
  json_value extraout_RDX_07;
  json_value extraout_RDX_08;
  json_value extraout_RDX_09;
  json_value extraout_RDX_10;
  json_value extraout_RDX_11;
  json_value extraout_RDX_12;
  json_value extraout_RDX_13;
  json_value extraout_RDX_14;
  json_value extraout_RDX_15;
  json_value jVar6;
  int iVar7;
  undefined7 in_register_00000031;
  parser *this_03;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_04;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  bVar8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  value_1;
  string_t s;
  parse_event_t local_f1;
  parser *local_f0;
  undefined1 local_e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_b8;
  int local_a4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  this_03 = (parser *)CONCAT71(in_register_00000031,keep);
  *(undefined1 *)&this->depth = 8;
  assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)this);
  switch(this_03->last_token) {
  case literal_true:
    tVar3 = lexer::scan(&this_03->m_lexer);
    this_03->last_token = tVar3;
    *(undefined1 *)&this->depth = 4;
    *(undefined8 *)&(this->callback).super__Function_base._M_functor = 1;
    jVar6 = extraout_RDX;
    break;
  case literal_false:
    tVar3 = lexer::scan(&this_03->m_lexer);
    this_03->last_token = tVar3;
    *(undefined1 *)&this->depth = 4;
    *(undefined8 *)&(this->callback).super__Function_base._M_functor = 0;
    jVar6 = extraout_RDX_05;
    break;
  case literal_null:
    tVar3 = lexer::scan(&this_03->m_lexer);
    this_03->last_token = tVar3;
    *(undefined1 *)&this->depth = 0;
    jVar6 = extraout_RDX_01;
    break;
  case value_string:
    lexer::get_string((string_t *)(local_e8 + 0x10),&this_03->m_lexer);
    tVar3 = lexer::scan(&this_03->m_lexer);
    this_03->last_token = tVar3;
    basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)&local_90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_e8 + 0x10));
    assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)&local_90);
    iVar7 = this->depth;
    *(char *)&this->depth = local_90._M_local_buf[0];
    uVar5 = *(undefined8 *)&(this->callback).super__Function_base._M_functor;
    *(undefined8 *)&(this->callback).super__Function_base._M_functor = local_90._8_8_;
    local_90._M_local_buf[0] = (char)iVar7;
    local_90._8_8_ = uVar5;
    assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)this);
    ~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)&local_90);
    jVar6 = extraout_RDX_02;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_e8._20_4_,local_e8._16_4_) != &local_c8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_e8._20_4_,local_e8._16_4_),
                      local_c8._M_allocated_capacity + 1);
      jVar6 = extraout_RDX_03;
    }
    break;
  case value_number:
    lexer::get_number(&this_03->m_lexer,
                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)this);
    tVar3 = lexer::scan(&this_03->m_lexer);
    this_03->last_token = tVar3;
    jVar6 = extraout_RDX_00;
    break;
  case begin_array:
    if (in_DL != 0) {
      if ((this_03->callback).super__Function_base._M_manager != (_Manager_type)0x0) {
        local_e8._16_4_ = this_03->depth;
        this_03->depth = local_e8._16_4_ + 1;
        local_e8[0] = array_start;
        in_DL = (*(this_03->callback)._M_invoker)
                          ((_Any_data *)&this_03->callback,(int *)(local_e8 + 0x10),local_e8,
                           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)this);
        if (!(bool)in_DL) goto LAB_0011e276;
      }
      *(undefined1 *)&this->depth = 2;
      puVar4 = (undefined8 *)operator_new(0x18);
      *puVar4 = 0;
      puVar4[1] = 0;
      puVar4[2] = 0;
      *(undefined8 **)&(this->callback).super__Function_base._M_functor = puVar4;
    }
LAB_0011e276:
    this_00 = &this_03->m_lexer;
    tVar3 = lexer::scan(this_00);
    this_03->last_token = tVar3;
    if (tVar3 == end_array) {
      tVar3 = lexer::scan(this_00);
      this_03->last_token = tVar3;
      jVar6 = extraout_RDX_07;
      if ((this_03->callback).super__Function_base._M_manager == (_Manager_type)0x0)
      goto LAB_0011e693;
      local_e8._16_4_ = this_03->depth + -1;
      this_03->depth = local_e8._16_4_;
      local_e8[0] = array_end;
      bVar2 = (*(this_03->callback)._M_invoker)
                        ((_Any_data *)&this_03->callback,(int *)(local_e8 + 0x10),local_e8,
                         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)this);
      jVar6 = extraout_RDX_08;
      if (bVar2) goto LAB_0011e693;
      this_04 = &local_60;
    }
    else {
      unexpect(this_03,value_separator);
      this_01 = (parser *)(local_e8 + 0x10);
      do {
        if (this_03->last_token == value_separator) {
          tVar3 = lexer::scan(this_00);
          this_03->last_token = tVar3;
        }
        parse_internal(this_01,keep);
        if ((local_e8[0x10] != '\b' & in_DL) == 1) {
          push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                             *)this_01);
        }
        ~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)this_01);
      } while (this_03->last_token == value_separator);
      expect(this_03,end_array);
      tVar3 = lexer::scan(this_00);
      this_03->last_token = tVar3;
      jVar6 = extraout_RDX_11;
      if ((in_DL & (this_03->callback).super__Function_base._M_manager != (_Manager_type)0x0) != 1)
      goto LAB_0011e693;
      iVar7 = this_03->depth + -1;
      this_03->depth = iVar7;
      bVar2 = std::
              function<bool_(int,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
              ::operator()(&this_03->callback,iVar7,array_end,
                           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)this);
      jVar6 = extraout_RDX_12;
      if (bVar2) goto LAB_0011e693;
      this_04 = &local_70;
    }
    goto LAB_0011e674;
  case begin_object:
    if (in_DL != 0) {
      if ((this_03->callback).super__Function_base._M_manager != (_Manager_type)0x0) {
        local_e8._16_4_ = this_03->depth;
        this_03->depth = local_e8._16_4_ + 1;
        local_e8[0] = object_start;
        in_DL = (*(this_03->callback)._M_invoker)
                          ((_Any_data *)&this_03->callback,(int *)(local_e8 + 0x10),local_e8,
                           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)this);
        if (!(bool)in_DL) goto LAB_0011e34a;
      }
      *(undefined1 *)&this->depth = 1;
      puVar4 = (undefined8 *)operator_new(0x30);
      puVar4[2] = 0;
      puVar4[3] = 0;
      puVar4[4] = 0;
      puVar4[5] = 0;
      *puVar4 = 0;
      puVar4[1] = 0;
      puVar4[3] = puVar4 + 1;
      puVar4[4] = puVar4 + 1;
      puVar4[5] = 0;
      *(undefined8 **)&(this->callback).super__Function_base._M_functor = puVar4;
    }
LAB_0011e34a:
    uVar5 = &this_03->m_lexer;
    tVar3 = lexer::scan((lexer *)uVar5);
    this_03->last_token = tVar3;
    if (tVar3 == end_object) {
      tVar3 = lexer::scan((lexer *)uVar5);
      this_03->last_token = tVar3;
      jVar6 = extraout_RDX_09;
      if ((in_DL & (this_03->callback).super__Function_base._M_manager != (_Manager_type)0x0) != 1)
      goto LAB_0011e693;
      iVar7 = this_03->depth + -1;
      this_03->depth = iVar7;
      bVar2 = std::
              function<bool_(int,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
              ::operator()(&this_03->callback,iVar7,object_end,
                           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)this);
      jVar6 = extraout_RDX_10;
      if (bVar2) goto LAB_0011e693;
      this_04 = &local_40;
    }
    else {
      unexpect(this_03,value_separator);
      local_a0._M_allocated_capacity = (size_type)&this_03->callback;
      local_f0 = this;
      local_a0._8_8_ = uVar5;
      do {
        if (this_03->last_token == value_separator) {
          tVar3 = lexer::scan((lexer *)uVar5);
          this_03->last_token = tVar3;
        }
        expect(this_03,value_string);
        lexer::get_string((string_t *)(local_e8 + 0x10),(lexer *)uVar5);
        if (in_DL == 0) {
          bVar2 = false;
        }
        else if ((this_03->callback).super__Function_base._M_manager == (_Manager_type)0x0) {
          bVar2 = true;
        }
        else {
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_e8 + 0x10));
          local_a4 = this_03->depth;
          local_f1 = key;
          if ((this_03->callback).super__Function_base._M_manager == (_Manager_type)0x0) {
            uVar5 = std::__throw_bad_function_call();
            local_f0 = (parser *)(ulong)in_DL;
            ~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                         *)(ulong)in_DL);
            _Unwind_Resume(uVar5);
          }
          bVar2 = (*(this_03->callback)._M_invoker)
                            ((_Any_data *)local_a0._M_allocated_capacity,&local_a4,&local_f1,
                             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)local_e8);
          ~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)local_e8);
        }
        tVar3 = lexer::scan((lexer *)uVar5);
        this_03->last_token = tVar3;
        expect(this_03,name_separator);
        tVar3 = lexer::scan((lexer *)uVar5);
        this_03->last_token = tVar3;
        parse_internal((parser *)local_e8,keep);
        if (((bVar2 & in_DL) == 1) && (local_e8[0] != 8)) {
          local_b8.m_type = local_e8[0];
          local_b8.m_value = (json_value)local_e8._8_8_;
          assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_e8);
          local_e8[0] = object_start;
          local_e8._8_8_ = (object_t *)0x0;
          assert_invariant(&local_b8);
          this_02 = operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                *)local_f0,(key_type *)(local_e8 + 0x10));
          assert_invariant(&local_b8);
          vVar1 = this_02->m_type;
          this_02->m_type = local_b8.m_type;
          jVar6 = this_02->m_value;
          this_02->m_value = local_b8.m_value;
          local_b8.m_type = vVar1;
          local_b8.m_value = jVar6;
          assert_invariant(this_02);
          ~basic_json(&local_b8);
          uVar5 = local_a0._8_8_;
        }
        ~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_e8._20_4_,local_e8._16_4_) != &local_c8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_e8._20_4_,local_e8._16_4_),
                          local_c8._M_allocated_capacity + 1);
        }
        this = local_f0;
      } while (this_03->last_token == value_separator);
      expect(this_03,end_object);
      tVar3 = lexer::scan((lexer *)uVar5);
      this_03->last_token = tVar3;
      jVar6 = extraout_RDX_13;
      if ((in_DL & (this_03->callback).super__Function_base._M_manager != (_Manager_type)0x0) != 1)
      goto LAB_0011e693;
      iVar7 = this_03->depth + -1;
      this_03->depth = iVar7;
      bVar2 = std::
              function<bool_(int,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
              ::operator()((function<bool_(int,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                            *)local_a0._M_allocated_capacity,iVar7,object_end,
                           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)this);
      jVar6 = extraout_RDX_14;
      if (bVar2) goto LAB_0011e693;
      this_04 = &local_50;
    }
LAB_0011e674:
    this_04->_M_local_buf[0] = '\b';
    assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)this_04);
    operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               *)this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)this_04);
    goto LAB_0011e68b;
  default:
    unexpect(this_03,this_03->last_token);
    jVar6 = extraout_RDX_04;
  }
  if ((in_DL != 0) && ((this_03->callback).super__Function_base._M_manager != (_Manager_type)0x0)) {
    local_e8._16_4_ = this_03->depth;
    local_e8[0] = value;
    bVar2 = (*(this_03->callback)._M_invoker)
                      ((_Any_data *)&this_03->callback,(int *)(local_e8 + 0x10),local_e8,
                       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)this);
    jVar6 = extraout_RDX_06;
    if (!bVar2) {
      this_04 = &local_80;
      local_80._M_local_buf[0] = '\b';
      assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)this_04);
      assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)this_04);
      iVar7 = this->depth;
      *(char *)&this->depth = local_80._M_local_buf[0];
      uVar5 = *(undefined8 *)&(this->callback).super__Function_base._M_functor;
      *(undefined8 *)&(this->callback).super__Function_base._M_functor = local_80._8_8_;
      local_80._M_local_buf[0] = (char)iVar7;
      local_80._8_8_ = uVar5;
      assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)this);
LAB_0011e68b:
      ~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)this_04);
      jVar6 = extraout_RDX_15;
    }
  }
LAB_0011e693:
  bVar8.m_value.object = jVar6.object;
  bVar8._0_8_ = this;
  return bVar8;
}

Assistant:

basic_json parse_internal(bool keep)
        {
            auto result = basic_json(value_t::discarded);

            switch (last_token)
            {
                case lexer::token_type::begin_object:
                {
                    if (keep and (not callback
                                  or ((keep = callback(depth++, parse_event_t::object_start, result)) != 0)))
                    {
                        // explicitly set result to object to cope with {}
                        result.m_type = value_t::object;
                        result.m_value = value_t::object;
                    }

                    // read next token
                    get_token();

                    // closing } -> we are done
                    if (last_token == lexer::token_type::end_object)
                    {
                        get_token();
                        if (keep and callback and not callback(--depth, parse_event_t::object_end, result))
                        {
                            result = basic_json(value_t::discarded);
                        }
                        return result;
                    }

                    // no comma is expected here
                    unexpect(lexer::token_type::value_separator);

                    // otherwise: parse key-value pairs
                    do
                    {
                        // ugly, but could be fixed with loop reorganization
                        if (last_token == lexer::token_type::value_separator)
                        {
                            get_token();
                        }

                        // store key
                        expect(lexer::token_type::value_string);
                        const auto key = m_lexer.get_string();

                        bool keep_tag = false;
                        if (keep)
                        {
                            if (callback)
                            {
                                basic_json k(key);
                                keep_tag = callback(depth, parse_event_t::key, k);
                            }
                            else
                            {
                                keep_tag = true;
                            }
                        }

                        // parse separator (:)
                        get_token();
                        expect(lexer::token_type::name_separator);

                        // parse and add value
                        get_token();
                        auto value = parse_internal(keep);
                        if (keep and keep_tag and not value.is_discarded())
                        {
                            result[key] = std::move(value);
                        }
                    }
                    while (last_token == lexer::token_type::value_separator);

                    // closing }
                    expect(lexer::token_type::end_object);
                    get_token();
                    if (keep and callback and not callback(--depth, parse_event_t::object_end, result))
                    {
                        result = basic_json(value_t::discarded);
                    }

                    return result;
                }

                case lexer::token_type::begin_array:
                {
                    if (keep and (not callback
                                  or ((keep = callback(depth++, parse_event_t::array_start, result)) != 0)))
                    {
                        // explicitly set result to object to cope with []
                        result.m_type = value_t::array;
                        result.m_value = value_t::array;
                    }

                    // read next token
                    get_token();

                    // closing ] -> we are done
                    if (last_token == lexer::token_type::end_array)
                    {
                        get_token();
                        if (callback and not callback(--depth, parse_event_t::array_end, result))
                        {
                            result = basic_json(value_t::discarded);
                        }
                        return result;
                    }

                    // no comma is expected here
                    unexpect(lexer::token_type::value_separator);

                    // otherwise: parse values
                    do
                    {
                        // ugly, but could be fixed with loop reorganization
                        if (last_token == lexer::token_type::value_separator)
                        {
                            get_token();
                        }

                        // parse value
                        auto value = parse_internal(keep);
                        if (keep and not value.is_discarded())
                        {
                            result.push_back(std::move(value));
                        }
                    }
                    while (last_token == lexer::token_type::value_separator);

                    // closing ]
                    expect(lexer::token_type::end_array);
                    get_token();
                    if (keep and callback and not callback(--depth, parse_event_t::array_end, result))
                    {
                        result = basic_json(value_t::discarded);
                    }

                    return result;
                }

                case lexer::token_type::literal_null:
                {
                    get_token();
                    result.m_type = value_t::null;
                    break;
                }

                case lexer::token_type::value_string:
                {
                    const auto s = m_lexer.get_string();
                    get_token();
                    result = basic_json(s);
                    break;
                }

                case lexer::token_type::literal_true:
                {
                    get_token();
                    result.m_type = value_t::boolean;
                    result.m_value = true;
                    break;
                }

                case lexer::token_type::literal_false:
                {
                    get_token();
                    result.m_type = value_t::boolean;
                    result.m_value = false;
                    break;
                }

                case lexer::token_type::value_number:
                {
                    m_lexer.get_number(result);
                    get_token();
                    break;
                }

                default:
                {
                    // the last token was unexpected
                    unexpect(last_token);
                }
            }

            if (keep and callback and not callback(depth, parse_event_t::value, result))
            {
                result = basic_json(value_t::discarded);
            }
            return result;
        }